

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O2

int __thiscall n_pca::NPca::detector(NPca *this,u_char *image_data)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  ulong cols;
  RealScalar RVar5;
  MatrixXd detector_zero_matrix;
  double local_158;
  MatrixXd detector_data_matrix;
  MatrixXd detector_matrix;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_118;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_e0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_68 [56];
  
  cols = (long)this->n_config_->image_width_ * (long)this->n_config_->image_height_;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&local_e0,1,cols);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&detector_matrix,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_e0);
  uVar3 = 0;
  uVar4 = 0;
  pdVar2 = detector_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  if (0 < (int)cols) {
    uVar4 = cols & 0xffffffff;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *pdVar2 = (double)image_data[uVar3];
    pdVar2 = pdVar2 + detector_matrix.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&detector_zero_matrix,
             (DenseStorage<double,__1,__1,__1,_0> *)&detector_matrix);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_e0.m_lhs,&this->train_mean_,0);
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_118,&detector_zero_matrix,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)&local_118,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             &local_e0);
  local_e0.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>._0_16_ =
       Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                 ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&detector_zero_matrix,
                  (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->basic_matrix_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&detector_data_matrix,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_e0);
  local_158 = -1.0;
  uVar3 = 0;
  for (uVar4 = 0;
      (long)uVar4 <
      (this->train_data_matrix_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
      m_storage.m_rows; uVar4 = uVar4 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              (&local_118,&detector_data_matrix,0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_68,
               &this->train_data_matrix_,uVar4);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator-
              (&local_e0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
               &local_118,local_68);
    RVar5 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
            ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                           *)&local_e0);
    if (local_158 < 0.0 || RVar5 < local_158) {
      uVar3 = uVar4 & 0xffffffff;
      local_158 = RVar5;
    }
  }
  iVar1 = (this->train_label_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar3];
  free(detector_data_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  free(detector_zero_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  free(detector_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  return iVar1;
}

Assistant:

int NPca::detector(u_char* image_data)
{
    int size = n_config_->image_height_ * n_config_->image_width_;  
    MatrixXd detector_matrix = MatrixXd::Zero(1, size);

    for (int i = 0; i < size; i++)
        detector_matrix.coeffRef(0, i) = image_data[i];

    MatrixXd detector_zero_matrix = detector_matrix;

    detector_zero_matrix.row(0) -= train_mean_.row(0);

    MatrixXd detector_data_matrix = detector_zero_matrix * basic_matrix_;
    int match_index = 0;
    double min_difference = -1;
    for (int i = 0; i < train_data_matrix_.rows(); i++)
    {
        double difference = (detector_data_matrix.row(0) - train_data_matrix_.row(i)).squaredNorm();
        if (min_difference < 0 || min_difference > difference)
        {
            min_difference = difference;
            match_index = i;
        }
    }

    return train_label_[match_index];
}